

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_update_recv_connection_window_size(nghttp2_session *session,size_t delta_size)

{
  int iVar1;
  size_t in_RSI;
  long in_RDI;
  int rv;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t window_size_increment;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = adjust_recv_window_size((int32_t *)(in_RDI + 0xb10),in_RSI,*(int32_t *)(in_RDI + 0xb1c));
  window_size_increment = (int32_t)(in_RSI >> 0x20);
  if (iVar1 == 0) {
    if ((((*(uint *)(in_RDI + 0xb64) & 1) == 0) && (*(char *)(in_RDI + 0xb76) == '\0')) &&
       (iVar1 = nghttp2_should_send_window_update
                          (*(int32_t *)(in_RDI + 0xb1c),*(int32_t *)(in_RDI + 0xb10)), iVar1 != 0))
    {
      iVar1 = nghttp2_session_add_window_update
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (uint8_t)((ulong)in_RDI >> 0x38),(int32_t)in_RDI,window_size_increment);
      if (iVar1 != 0) {
        return iVar1;
      }
      *(undefined4 *)(in_RDI + 0xb10) = 0;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = nghttp2_session_terminate_session
                      ((nghttp2_session *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  return iVar1;
}

Assistant:

int nghttp2_session_update_recv_connection_window_size(nghttp2_session *session,
                                                       size_t delta_size) {
  int rv;
  rv = adjust_recv_window_size(&session->recv_window_size, delta_size,
                               session->local_window_size);
  if (rv != 0) {
    return nghttp2_session_terminate_session(session,
                                             NGHTTP2_FLOW_CONTROL_ERROR);
  }
  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) &&
      session->window_update_queued == 0 &&
      nghttp2_should_send_window_update(session->local_window_size,
                                        session->recv_window_size)) {
    /* Use stream ID 0 to update connection-level flow control
       window */
    rv = nghttp2_session_add_window_update(session, NGHTTP2_FLAG_NONE, 0,
                                           session->recv_window_size);
    if (rv != 0) {
      return rv;
    }

    session->recv_window_size = 0;
  }
  return 0;
}